

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::OnInitExprV128ConstExpr
          (BinaryReaderIR *this,Index index,v128 value)

{
  intrusive_list<wabt::Expr> *this_00;
  undefined8 uVar1;
  Location *in_R8;
  v128 val;
  Location loc;
  Expr *local_a0;
  _Head_base<0UL,_wabt::Expr_*,_false> local_98;
  Location local_90;
  Const local_70;
  
  uVar1 = value.v._8_8_;
  GetLocation(&local_90,this);
  this_00 = this->current_init_expr_;
  val.v._8_8_ = &local_90;
  val.v[0] = (char)uVar1;
  val.v[1] = (char)((ulong)uVar1 >> 8);
  val.v[2] = (char)((ulong)uVar1 >> 0x10);
  val.v[3] = (char)((ulong)uVar1 >> 0x18);
  val.v[4] = (char)((ulong)uVar1 >> 0x20);
  val.v[5] = (char)((ulong)uVar1 >> 0x28);
  val.v[6] = (char)((ulong)uVar1 >> 0x30);
  val.v[7] = (char)((ulong)uVar1 >> 0x38);
  Const::V128(&local_70,value.v._0_8_,val,in_R8);
  MakeUnique<wabt::ConstExpr,wabt::Const,wabt::Location&>((wabt *)&local_a0,&local_70,&local_90);
  local_98._M_head_impl = local_a0;
  local_a0 = (Expr *)0x0;
  intrusive_list<wabt::Expr>::push_back
            (this_00,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_98);
  if (local_98._M_head_impl != (Expr *)0x0) {
    (*(local_98._M_head_impl)->_vptr_Expr[1])();
  }
  local_98._M_head_impl = (Expr *)0x0;
  if (local_a0 != (Expr *)0x0) {
    (**(code **)(*(long *)local_a0 + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnInitExprV128ConstExpr(Index index, v128 value) {
  Location loc = GetLocation();
  current_init_expr_->push_back(
      MakeUnique<ConstExpr>(Const::V128(value, loc), loc));
  return Result::Ok;
}